

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_int>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [76],
               uint *params_1,uint *params_2)

{
  char (*pacVar1) [76];
  LogSeverity line_00;
  uint uVar2;
  Debug *this;
  undefined4 in_register_00000014;
  uint *params_00;
  uint *params_01;
  ArrayPtr<kj::String> AVar3;
  ArrayPtr<kj::String> in_stack_fffffffffffffef8;
  String *local_d0;
  String local_78;
  String local_60;
  String local_48;
  kj *local_30;
  uint *params_local_1;
  char (*params_local) [76];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  local_30 = (kj *)params_1;
  params_local_1 = (uint *)params;
  params_local = (char (*) [76])macroArgs;
  macroArgs_local._0_4_ = severity;
  macroArgs_local._4_4_ = line;
  _severity_local = (Debug *)file;
  str<char_const(&)[76]>
            (&local_78,(kj *)params,(char (*) [76])CONCAT44(in_register_00000014,severity));
  str<unsigned_int&>(&local_60,local_30,params_00);
  str<unsigned_int&>(&local_48,(kj *)params_2,params_01);
  this = _severity_local;
  uVar2 = macroArgs_local._4_4_;
  line_00 = (LogSeverity)macroArgs_local;
  pacVar1 = params_local;
  AVar3 = arrayPtr<kj::String>(&local_78,3);
  logInternal(this,(char *)(ulong)uVar2,line_00,(LogSeverity)pacVar1,(char *)AVar3.ptr,
              in_stack_fffffffffffffef8);
  local_d0 = (String *)&stack0xffffffffffffffd0;
  do {
    local_d0 = local_d0 + -1;
    String::~String(local_d0);
  } while (local_d0 != &local_78);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}